

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 *in_RCX;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  ulong in_R8;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int skipInputConvert;
  int skipOutputConvert;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long frameCount;
  uint i;
  uint destChannelStrideBytes;
  uint destSampleStrideSamples;
  uint srcChannelStrideBytes;
  uint srcSampleStrideSamples;
  uchar *destBytePtr;
  uchar *srcBytePtr;
  void *userOutput;
  void *userInput;
  ulong local_88;
  unsigned_long local_78;
  ulong local_70;
  uint local_5c;
  uint local_58;
  undefined4 local_54;
  uint local_50;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined8 local_38;
  long local_30;
  undefined4 uVar8;
  
  local_78 = 0;
  bVar3 = false;
  bVar2 = false;
  local_70 = in_R8;
  if (*in_RSI == 0) {
    do {
      if (*(ulong *)(in_RDI + 0x20) < local_70) {
        local_88 = *(ulong *)(in_RDI + 0x20);
      }
      else {
        local_88 = local_70;
      }
      iVar1 = (int)local_88;
      if (*(int *)(in_RDI + 0x28) == 0) {
        local_30 = 0;
      }
      else {
        local_48 = *(long *)(in_RDI + 0x78);
        if (*(int *)(in_RDI + 0x34) == 0) {
          local_54 = 1;
          local_58 = iVar1 * *(int *)(in_RDI + 0x30);
          if (((*(int *)(in_RDI + 0x1c) == 0) || (*(int *)(in_RDI + 0xb8) != 0)) ||
             (**(long **)(in_RDI + 0xd0) == 0)) {
            for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x28); local_5c = local_5c + 1) {
              *(ulong *)(*(long *)(in_RDI + 0x80) + (ulong)local_5c * 8) =
                   *(long *)(in_RDI + 0x78) + (local_5c * *(int *)(in_RDI + 0x30)) * local_88;
            }
          }
          else {
            for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x28); local_5c = local_5c + 1) {
              *(long *)(*(long *)(in_RDI + 0x80) + (ulong)local_5c * 8) =
                   in_RDX[(ulong)local_5c * 2];
            }
            bVar2 = true;
          }
          local_30 = *(long *)(in_RDI + 0x80);
        }
        else {
          local_54 = *(undefined4 *)(in_RDI + 0x28);
          local_58 = *(uint *)(in_RDI + 0x30);
          if (((*(int *)(in_RDI + 0x1c) == 0) || (*(int *)(in_RDI + 0xb8) == 0)) ||
             ((**(long **)(in_RDI + 0xd0) == 0 || (*(int *)(in_RDI + 0x28) != (int)in_RDX[1])))) {
            local_30 = *(long *)(in_RDI + 0x78);
          }
          else {
            local_30 = *in_RDX;
            local_48 = *in_RDX;
            bVar2 = true;
          }
        }
        if (**(long **)(in_RDI + 0xd0) == 0) {
          for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x28); local_5c = local_5c + 1) {
            (**(code **)(in_RDI + 0x40))(local_48,local_54,local_88 & 0xffffffff);
            local_48 = local_48 + (ulong)local_58;
          }
        }
        else if (bVar2) {
          for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x28); local_5c = local_5c + 1) {
            in_RDX[(ulong)local_5c * 2] =
                 in_RDX[(ulong)local_5c * 2] +
                 local_88 * *(uint *)(in_RDX + (ulong)local_5c * 2 + 1) *
                 (ulong)*(uint *)(in_RDI + 0x2c);
          }
        }
        else {
          for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x28); local_5c = local_5c + 1) {
            (**(code **)(in_RDI + 0x38))
                      (local_48,local_54,in_RDX[(ulong)local_5c * 2],
                       (int)in_RDX[(ulong)local_5c * 2 + 1],local_88,in_RDI + 0x108);
            local_48 = local_48 + (ulong)local_58;
            in_RDX[(ulong)local_5c * 2] =
                 in_RDX[(ulong)local_5c * 2] +
                 local_88 * *(uint *)(in_RDX + (ulong)local_5c * 2 + 1) *
                 (ulong)*(uint *)(in_RDI + 0x2c);
          }
        }
      }
      if (*(int *)(in_RDI + 0x48) == 0) {
        local_38 = 0;
      }
      else if (*(int *)(in_RDI + 0x54) == 0) {
        if ((*(int *)(in_RDI + 0x18) == 0) || (*(int *)(in_RDI + 0xe0) != 0)) {
          for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x48); local_5c = local_5c + 1) {
            *(ulong *)(*(long *)(in_RDI + 0x98) + (ulong)local_5c * 8) =
                 *(long *)(in_RDI + 0x90) + (local_5c * *(int *)(in_RDI + 0x50)) * local_88;
          }
        }
        else {
          for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x48); local_5c = local_5c + 1) {
            *(undefined8 *)(*(long *)(in_RDI + 0x98) + (ulong)local_5c * 8) =
                 in_RCX[(ulong)local_5c * 2];
          }
          bVar3 = true;
        }
        local_38 = *(undefined8 *)(in_RDI + 0x98);
      }
      else if (((*(int *)(in_RDI + 0x18) == 0) || (*(int *)(in_RDI + 0xe0) == 0)) ||
              (*(int *)(in_RDI + 0x48) != *(int *)(in_RCX + 1))) {
        local_38 = *(undefined8 *)(in_RDI + 0x90);
      }
      else {
        local_38 = *in_RCX;
        bVar3 = true;
      }
      iVar4 = (**(code **)(in_RDI + 0x120))
                        (local_30,local_38,local_88,*(undefined8 *)(in_RDI + 0xa8),
                         *(undefined8 *)(in_RDI + 0xb0),*(undefined8 *)(in_RDI + 0x128));
      *in_RSI = iVar4;
      if (*in_RSI != 2) {
        uVar8 = (undefined4)(local_88 >> 0x20);
        auVar6._8_4_ = uVar8;
        auVar6._0_8_ = local_88;
        auVar6._12_4_ = 0x45300000;
        **(double **)(in_RDI + 0xa8) =
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) *
             *(double *)(in_RDI + 0x118) + **(double **)(in_RDI + 0xa8);
        auVar7._8_4_ = uVar8;
        auVar7._0_8_ = local_88;
        auVar7._12_4_ = 0x45300000;
        *(double *)(*(long *)(in_RDI + 0xa8) + 0x10) =
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) *
             *(double *)(in_RDI + 0x118) + *(double *)(*(long *)(in_RDI + 0xa8) + 0x10);
        if ((*(int *)(in_RDI + 0x48) != 0) && (**(long **)(in_RDI + 0xf8) != 0)) {
          if (bVar3) {
            for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x48); local_5c = local_5c + 1) {
              in_RCX[(ulong)local_5c * 2] =
                   in_RCX[(ulong)local_5c * 2] +
                   local_88 * *(uint *)(in_RCX + (ulong)local_5c * 2 + 1) *
                   (ulong)*(uint *)(in_RDI + 0x4c);
            }
          }
          else {
            local_40 = *(long *)(in_RDI + 0x90);
            if (*(int *)(in_RDI + 0x54) == 0) {
              local_4c = 1;
              local_50 = iVar1 * *(int *)(in_RDI + 0x50);
            }
            else {
              local_4c = *(undefined4 *)(in_RDI + 0x48);
              local_50 = *(uint *)(in_RDI + 0x50);
            }
            for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x48); local_5c = local_5c + 1) {
              (**(code **)(in_RDI + 0x58))
                        (in_RCX[(ulong)local_5c * 2],
                         *(undefined4 *)(in_RCX + (ulong)local_5c * 2 + 1),local_40,local_4c,
                         local_88,in_RDI + 0x108);
              local_40 = local_40 + (ulong)local_50;
              in_RCX[(ulong)local_5c * 2] =
                   in_RCX[(ulong)local_5c * 2] +
                   local_88 * *(uint *)(in_RCX + (ulong)local_5c * 2 + 1) *
                   (ulong)*(uint *)(in_RDI + 0x4c);
            }
          }
        }
        local_78 = local_88 + local_78;
        local_70 = local_70 - local_88;
      }
      bVar5 = false;
      if (local_70 != 0) {
        bVar5 = *in_RSI == 0;
      }
    } while (bVar5);
  }
  if (local_70 != 0) {
    if ((*(int *)(in_RDI + 0x48) != 0) && (**(long **)(in_RDI + 0xf8) != 0)) {
      for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x48); local_5c = local_5c + 1) {
        (**(code **)(in_RDI + 0x60))
                  (in_RCX[(ulong)local_5c * 2],*(undefined4 *)(in_RCX + (ulong)local_5c * 2 + 1),
                   local_70 & 0xffffffff);
        in_RCX[(ulong)local_5c * 2] =
             in_RCX[(ulong)local_5c * 2] +
             local_70 * *(uint *)(in_RCX + (ulong)local_5c * 2 + 1) *
             (ulong)*(uint *)(in_RDI + 0x4c);
      }
    }
    local_78 = local_70 + local_78;
  }
  return local_78;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {
                
                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved
                        && bp->hostInputChannels[0][0].data && bp->inputChannelCount == hostInputChannels[0].stride )
                    {
                        userInput = hostInputChannels[0].data;
                        destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                    }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->bytesPerUserInputSample * frameCount;
                        }
                    }
                
                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
	            {
                    if( skipInputConvert )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                    hostInputChannels[i].data,
                                                    hostInputChannels[i].stride,
                                                    frameCount, &bp->ditherGenerator );

                            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved
                          && bp->outputChannelCount == hostOutputChannels[0].stride )
                    {
                        userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->bytesPerUserOutputSample * frameCount;
                        }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }
        
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */
                
                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    	srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    	if( bp->userOutputIsInterleaved )
                    	{
                        	srcSampleStrideSamples = bp->outputChannelCount;
                        	srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    	}
                    	else /* user output is not interleaved */
                    	{
                        	srcSampleStrideSamples = 1;
                        	srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    	}

                    	for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	bp->outputConverter(    hostOutputChannels[i].data,
                                                	hostOutputChannels[i].stride,
                                                	srcBytePtr, srcSampleStrideSamples,
                                                	frameCount, &bp->ditherGenerator );

                        	srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                		frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
                }
             
                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}